

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_thread_test.cc
# Opt level: O2

int main(void)

{
  unsigned_long_long __val;
  uint __line;
  __type _Var1;
  RetCode RVar2;
  int iVar3;
  long lVar4;
  char *__assertion;
  long lVar5;
  string *this;
  string (*pasVar6) [1000];
  string *psVar7;
  long lVar8;
  allocator local_131;
  long local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  thread ths [4];
  string value;
  string *local_c0;
  string *local_b8;
  string engine_path;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&engine_path,
             "======================= multi thread test ============================",
             (allocator *)ths);
  printf_(&engine_path);
  std::__cxx11::string::~string((string *)&engine_path);
  std::__cxx11::string::string((string *)ths,"./data/test-",(allocator *)&local_128);
  __val = rdtsc();
  std::__cxx11::to_string(&value,__val);
  std::operator+(&engine_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ths,&value);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)ths);
  RVar2 = polar_race::Engine::Open(&engine_path,&engine);
  if (RVar2 == kSucc) {
    printf("open engine_path: %s\n",engine_path._M_dataplus._M_p);
    local_b8 = (string *)ks_abi_cxx11_;
    local_c0 = vs_abi_cxx11_[0];
    for (local_130 = 0; local_130 != 4; local_130 = local_130 + 1) {
      this = local_b8;
      psVar7 = local_c0;
      for (lVar4 = 0; lVar4 != 1000; lVar4 = lVar4 + 1) {
        gen_random(k,6);
        std::__cxx11::to_string(&local_90,(int)local_130);
        std::operator+(&local_128,&local_90,"th");
        std::__cxx11::string::string((string *)&local_70,k,&local_131);
        std::operator+(&value,&local_128,&local_70);
        std::__cxx11::to_string(&local_50,(int)lVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ths,
                       &value,&local_50);
        std::__cxx11::string::operator=(this,(string *)ths);
        std::__cxx11::string::~string((string *)ths);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_90);
        gen_random(v,0x403);
        std::__cxx11::string::assign((char *)psVar7);
        this = this + 0x20;
        psVar7 = psVar7 + 1;
      }
      local_b8 = local_b8 + 32000;
      local_c0 = local_c0 + 1000;
    }
    ths = (thread  [4])ZEXT1632(ZEXT816(0) << 0x40);
    local_130 = 4;
    iVar3 = 0;
    while (local_128._M_dataplus._M_p._0_4_ = iVar3, iVar3 < 4) {
      std::thread::thread<void(&)(int),int&,void>((thread *)&value,test_thread,(int *)&local_128);
      std::thread::operator=(ths + (int)local_128._M_dataplus._M_p,(thread *)&value);
      std::thread::~thread((thread *)&value);
      iVar3 = (int)local_128._M_dataplus._M_p + 1;
    }
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      std::thread::join();
    }
    value._M_dataplus._M_p = (pointer)&value.field_2;
    lVar5 = 0x10b8c8;
    pasVar6 = vs_abi_cxx11_;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    lVar4 = 0;
    while (lVar4 != 4) {
      lVar8 = 0;
      local_130 = lVar4;
      while (lVar8 + 0x20 != 0x7d20) {
        local_128._M_dataplus._M_p = *(pointer *)(lVar5 + -8 + lVar8);
        local_128._M_string_length = *(size_type *)(lVar5 + lVar8);
        iVar3 = (*engine->_vptr_Engine[3])(engine,&local_128,&value);
        if (iVar3 != 0) {
          __assertion = "ret == kSucc";
          __line = 0x51;
          goto LAB_00103bf2;
        }
        _Var1 = std::operator==(&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&(*pasVar6)[0]._M_dataplus._M_p + lVar8));
        lVar8 = lVar8 + 0x20;
        if (!_Var1) {
          __assertion = "value == vs[t][i]";
          __line = 0x52;
          goto LAB_00103bf2;
        }
      }
      lVar5 = lVar5 + 32000;
      pasVar6 = pasVar6 + 1;
      lVar4 = local_130 + 1;
    }
    for (local_90._M_dataplus._M_p._0_4_ = 0; (int)local_90._M_dataplus._M_p < 4;
        local_90._M_dataplus._M_p._0_4_ = (int)local_90._M_dataplus._M_p + 1) {
      std::thread::thread<void(&)(int),int&,void>
                ((thread *)&local_128,test_thread_conflict,(int *)&local_90);
      std::thread::operator=(ths + (int)local_90._M_dataplus._M_p,(thread *)&local_128);
      std::thread::~thread((thread *)&local_128);
    }
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      std::thread::join();
    }
    pasVar6 = vs_abi_cxx11_;
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 0x32) {
        if (engine != (Engine *)0x0) {
          (*engine->_vptr_Engine[1])();
        }
        std::__cxx11::string::string
                  ((string *)&local_128,
                   "======================= multi thread test pass :) ======================",
                   (allocator *)&local_90);
        printf_(&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&value);
        lVar4 = 0x18;
        do {
          std::thread::~thread((thread *)((long)&ths[0]._M_id._M_thread + lVar4));
          lVar4 = lVar4 + -8;
        } while (lVar4 != -8);
        std::__cxx11::string::~string((string *)&engine_path);
        return 0;
      }
      local_128._M_dataplus._M_p = ks_abi_cxx11_[0][lVar4]._M_dataplus._M_p;
      local_128._M_string_length = ks_abi_cxx11_[0][lVar4]._M_string_length;
      iVar3 = (*engine->_vptr_Engine[3])(engine,&local_128,&value);
      if (iVar3 != 0) break;
      lVar5 = 0;
      do {
        if (lVar5 + 32000 == 160000) {
          __assertion = "found";
          __line = 0x68;
          goto LAB_00103bf2;
        }
        _Var1 = std::operator==(&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&(((string *)&(*pasVar6)[0]._M_dataplus)->
                                                  _M_dataplus)._M_p + lVar5));
        lVar5 = lVar5 + 32000;
      } while (!_Var1);
      lVar4 = lVar4 + 1;
      pasVar6 = (string (*) [1000])((long)pasVar6 + 0x20);
    }
    __assertion = "ret == kSucc";
    __line = 0x5f;
  }
  else {
    __assertion = "ret == kSucc";
    __line = 0x38;
  }
LAB_00103bf2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {

    printf_(
        "======================= multi thread test "
        "============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    RetCode ret = Engine::Open(engine_path, &engine);
    assert(ret == kSucc);
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            gen_random(k, 6);
            ks[t][i] = std::to_string(t) + "th" + std::string(k) + std::to_string(i);

            gen_random(v, 1027);
            vs[t][i] = v;
        }
    }

    std::thread ths[THREAD_NUM];
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }

    std::string value;
    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            ret = engine->Read(ks[t][i], &value);
            assert(ret == kSucc);
            assert(value == vs[t][i]);
        }
    }

    ////////////////////////////////////////////////////////////////////
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread_conflict, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }
    for (int i = 0; i < CONFLICT_KEY; ++i) {
        ret = engine->Read(ks[0][i], &value);
        assert(ret == kSucc);

        bool found = false;
        for (int t = 0; t < THREAD_NUM; ++t) {
            if (value == vs[t][i]) {
                found = true;
                break;
            }
        }
        assert(found);
    }

    delete engine;


    printf_(
        "======================= multi thread test pass :) "
        "======================");

    return 0;
}